

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> * __thiscall
slang::ast::Compilation::getDefinitions
          (vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>
           *__return_storage_ptr__,Compilation *this)

{
  pointer ppSVar1;
  Symbol *pSVar2;
  const_iterator __position;
  uint uVar3;
  ushort uVar4;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  ulong uVar5;
  char_pointer puVar6;
  _Cat _Var7;
  char_pointer puVar8;
  char_pointer puVar9;
  table_element_pointer ppVar10;
  pointer ppSVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  iterator iVar15;
  Symbol *sym;
  char_pointer local_50;
  Symbol *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar15 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
           ::begin(&(this->definitionMap).table_);
  if (iVar15.p_ == (table_element_pointer)0x0) {
    return __return_storage_ptr__;
  }
LAB_002d6b1c:
  do {
    ppVar10 = iVar15.p_;
    ppSVar1 = (ppVar10->second).first.
              super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppSVar11 = (ppVar10->second).first.
                    super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppSVar11 != ppSVar1;
        ppSVar11 = ppSVar11 + 1) {
      pSVar2 = *ppSVar11;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_38 = pSVar2;
      uVar12 = (long)(__return_storage_ptr__->
                     super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current >> 3;
      while (uVar5 = uVar12, 0 < (long)uVar5) {
        uVar12 = uVar5 >> 1;
        __y._M_len = (__position._M_current[uVar12]->name)._M_len;
        __y._M_str = (__position._M_current[uVar12]->name)._M_str;
        __x._M_len = (pSVar2->name)._M_len;
        __x._M_str = (pSVar2->name)._M_str;
        _Var7 = std::operator<=><char,std::char_traits<char>>(__x,__y);
        if (-1 < _Var7._M_value) {
          __position._M_current = __position._M_current + uVar12 + 1;
          uVar12 = ~uVar12 + uVar5;
        }
      }
      std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>::insert
                (__return_storage_ptr__,__position,&local_38);
    }
    local_50 = iVar15.pc_;
    puVar9 = local_50 + 0x12;
    puVar6 = local_50 + 2;
    while (puVar8 = puVar6, ppVar10 = ppVar10 + 1, ((uint)local_50 & 0xf) != 0xe) {
      local_50 = local_50 + 1;
      puVar9 = puVar9 + 1;
      puVar6 = puVar8 + 1;
      if (puVar8[-1] != '\0') goto code_r0x002d6be0;
    }
    auVar13[0] = -(*puVar8 == '\0');
    auVar13[1] = -(puVar8[1] == '\0');
    auVar13[2] = -(puVar8[2] == '\0');
    auVar13[3] = -(puVar8[3] == '\0');
    auVar13[4] = -(puVar8[4] == '\0');
    auVar13[5] = -(puVar8[5] == '\0');
    auVar13[6] = -(puVar8[6] == '\0');
    auVar13[7] = -(puVar8[7] == '\0');
    auVar13[8] = -(puVar8[8] == '\0');
    auVar13[9] = -(puVar8[9] == '\0');
    auVar13[10] = -(puVar8[10] == '\0');
    auVar13[0xb] = -(puVar8[0xb] == '\0');
    auVar13[0xc] = -(puVar8[0xc] == '\0');
    auVar13[0xd] = -(puVar8[0xd] == '\0');
    auVar13[0xe] = -(puVar8[0xe] == '\0');
    auVar13[0xf] = -(puVar8[0xf] == '\0');
    uVar4 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe;
    while (uVar4 == 0x7fff) {
      ppVar10 = ppVar10 + 0xf;
      auVar14[0] = -(*puVar9 == '\0');
      auVar14[1] = -(puVar9[1] == '\0');
      auVar14[2] = -(puVar9[2] == '\0');
      auVar14[3] = -(puVar9[3] == '\0');
      auVar14[4] = -(puVar9[4] == '\0');
      auVar14[5] = -(puVar9[5] == '\0');
      auVar14[6] = -(puVar9[6] == '\0');
      auVar14[7] = -(puVar9[7] == '\0');
      auVar14[8] = -(puVar9[8] == '\0');
      auVar14[9] = -(puVar9[9] == '\0');
      auVar14[10] = -(puVar9[10] == '\0');
      auVar14[0xb] = -(puVar9[0xb] == '\0');
      auVar14[0xc] = -(puVar9[0xc] == '\0');
      auVar14[0xd] = -(puVar9[0xd] == '\0');
      auVar14[0xe] = -(puVar9[0xe] == '\0');
      auVar14[0xf] = -(puVar9[0xf] == '\0');
      puVar8 = puVar9;
      puVar9 = puVar9 + 0x10;
      uVar4 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe;
    }
    uVar3 = 0;
    if ((uVar4 ^ 0x7fff) != 0) {
      for (; ((uVar4 ^ 0x7fff) >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
    if (puVar8[uVar3] == '\x01') {
      return __return_storage_ptr__;
    }
    iVar15.p_ = ppVar10 + uVar3;
    iVar15.pc_ = puVar8 + uVar3;
  } while( true );
code_r0x002d6be0:
  if (puVar8[-1] == '\x01') {
    return __return_storage_ptr__;
  }
  iVar15.p_ = ppVar10;
  iVar15.pc_ = puVar8 + -1;
  goto LAB_002d6b1c;
}

Assistant:

std::vector<const Symbol*> Compilation::getDefinitions() const {
    std::vector<const Symbol*> result;
    for (auto& [key, val] : definitionMap) {
        for (auto sym : val.first) {
            result.insert(std::ranges::upper_bound(result, sym->name, {},
                                                   [](auto item) { return item->name; }),
                          sym);
        }
    }

    return result;
}